

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O2

int classify_arg(c2m_ctx_t c2m_ctx,type *type,MIR_type_t *types,int bit_field_p)

{
  MIR_type_t *pMVar1;
  node_t pnVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  MIR_type_t MVar6;
  MIR_type_t MVar7;
  int iVar8;
  mir_size_t mVar9;
  ulong uVar10;
  node_t_conflict pnVar11;
  MIR_type_t *pMVar12;
  MIR_type_t *pMVar13;
  char *__assertion;
  anon_union_16_10_0af5b411_for_u *paVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  MIR_type_t subtypes [2];
  
  mVar9 = type_size(c2m_ctx,type);
  if (type->mode - TM_STRUCT < 3) {
    iVar8 = 0;
    if (mVar9 + 7 < 0x18) {
      uVar15 = mVar9 + 7 >> 3;
      for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        types[uVar10] = 0x14;
      }
      uVar5 = type->mode - TM_STRUCT;
      if (uVar5 < 2) {
        pnVar11 = DLIST_node_t_el(&(((type->u).tag_type)->u).ops,1);
        paVar14 = &pnVar11->u;
        pMVar1 = types + 1;
        pMVar12 = pMVar1;
        while( true ) {
          iVar8 = (int)pMVar12;
          pnVar2 = (paVar14->ops).head;
          if (pnVar2 == (node_t)0x0) break;
          if (pnVar2->code == N_MEMBER) {
            pvVar3 = pnVar2->attr;
            uVar10 = *(ulong *)((long)pvVar3 + 0x10);
            if (*(long *)((long)pvVar3 + 0x48) != 0) {
              lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x48) + 8);
              if ((*(uint *)(*(long *)(lVar4 + 0x40) + 0x18) & 0xfffffffe) != 4) {
                __assertion = 
                "decl2->decl_spec.type->mode == TM_STRUCT || decl2->decl_spec.type->mode == TM_UNION"
                ;
                uVar5 = 0x45;
                goto LAB_00168d46;
              }
              uVar10 = uVar10 - *(long *)(lVar4 + 0x10);
              iVar8 = 4;
            }
            mVar9 = type_size(c2m_ctx,*(type **)((long)pvVar3 + 0x40));
            iVar16 = (int)(uVar10 >> 3);
            if (*(int *)((long)pvVar3 + 4) < 0) {
              uVar5 = classify_arg(c2m_ctx,*(type **)((long)pvVar3 + 0x40),subtypes,iVar8);
              if (uVar5 == 0) {
                return 0;
              }
              pMVar13 = (MIR_type_t *)(long)iVar16;
              pMVar12 = pMVar13;
              for (uVar17 = 0;
                  ((~((int)uVar5 >> 0x1f) & uVar5) != uVar17 && ((long)pMVar13 + uVar17 < uVar15));
                  uVar17 = uVar17 + 1) {
                MVar7 = subtypes[uVar17];
                MVar6 = get_result_type(MVar7,pMVar1[(long)pMVar13 + (uVar17 - 1)]);
                pMVar1[(long)pMVar13 + (uVar17 - 1)] = MVar6;
                if ((int)uVar5 <= (int)((uVar10 - 1) + mVar9 >> 3) - iVar16) {
                  MVar7 = get_result_type(MVar7,pMVar1[(long)pMVar13 + uVar17]);
                  pMVar1[(long)pMVar13 + uVar17] = MVar7;
                }
              }
            }
            else {
              pMVar12 = (MIR_type_t *)(ulong)types[iVar16];
              if (types[iVar16] != MIR_T_UNDEF) {
                pMVar12 = (MIR_type_t *)0x6;
              }
              types[iVar16] = (MIR_type_t)pMVar12;
            }
          }
          paVar14 = (anon_union_16_10_0af5b411_for_u *)&(pnVar2->op_link).next;
        }
      }
      else {
        if (type->mode != TM_ARR) {
          __assertion = "FALSE";
          uVar5 = 0x5b;
          goto LAB_00168d46;
        }
        iVar8 = classify_arg(c2m_ctx,((type->u).ptr_type)->arr_type,subtypes,uVar5);
        if (iVar8 == 0) {
          return 0;
        }
        for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
          MVar7 = get_result_type(types[uVar10],
                                  subtypes[(long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                                 uVar10 & 0xffffffff) % (long)iVar8 & 0xffffffff]);
          types[uVar10] = MVar7;
        }
      }
      for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        if (types[uVar10] == 0x15) {
          if (uVar10 == 0) {
            return 0;
          }
          if (types[uVar10 - 1] != MIR_T_LD) {
            return 0;
          }
        }
        else if (types[uVar10] == MIR_T_UNDEF) {
          return 0;
        }
      }
      iVar8 = (int)uVar15;
    }
  }
  else {
    iVar8 = scalar_type_p(type);
    if (iVar8 == 0) {
      __assertion = "scalar_type_p (type)";
      uVar5 = 0x6c;
LAB_00168d46:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                    ,uVar5,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
    }
    MVar7 = get_mir_type(c2m_ctx,type);
    if (MVar7 - MIR_T_F < 2) {
      *types = MIR_T_D;
    }
    else {
      if (MVar7 == MIR_T_LD) {
        types[0] = MIR_T_LD;
        types[1] = 0x15;
        return 2;
      }
      *types = MIR_T_I64;
    }
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static int classify_arg (c2m_ctx_t c2m_ctx, struct type *type, MIR_type_t types[MAX_QWORDS],
                         int bit_field_p MIR_UNUSED) {
  size_t size = type_size (c2m_ctx, type), n_qwords = (size + 7) / 8;
  MIR_type_t mir_type;

  if (type->mode == TM_STRUCT || type->mode == TM_UNION || type->mode == TM_ARR) {
    if (n_qwords > MAX_QWORDS) return 0; /* too big aggregate */

#ifndef _WIN32
    MIR_type_t subtypes[MAX_QWORDS];
    int i, n_el_qwords;
    for (i = 0; (size_t) i < n_qwords; i++) types[i] = (MIR_type_t) NO_CLASS;

    switch (type->mode) {
    case TM_ARR: { /* Arrays are handled as small records.  */
      n_el_qwords = classify_arg (c2m_ctx, type->u.arr_type->el_type, subtypes, FALSE);
      if (n_el_qwords == 0) return 0;
      /* make full types: */
      for (i = 0; (size_t) i < n_qwords; i++)
        types[i] = get_result_type (types[i], subtypes[i % n_el_qwords]);
      break;
    }
    case TM_STRUCT:
    case TM_UNION:
      for (node_t el = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); el != NULL;
           el = NL_NEXT (el))
        if (el->code == N_MEMBER) {
          decl_t decl = el->attr;
          mir_size_t offset = decl->offset;
          node_t container;
          if ((container = decl->containing_unnamed_anon_struct_union_member) != NULL) {
            decl_t decl2 = container->attr;
            assert (decl2->decl_spec.type->mode == TM_STRUCT
                    || decl2->decl_spec.type->mode == TM_UNION);
            offset -= decl2->offset;
          }
          int start_qword = offset / 8;
          int end_qword = (offset + type_size (c2m_ctx, decl->decl_spec.type) - 1) / 8;
          int span_qwords = end_qword - start_qword + 1;

          if (decl->bit_offset >= 0) {
            types[start_qword] = get_result_type (MIR_T_I64, types[start_qword]);
          } else {
            n_el_qwords
              = classify_arg (c2m_ctx, decl->decl_spec.type, subtypes, decl->bit_offset >= 0);
            if (n_el_qwords == 0) return 0;
            for (i = 0; i < n_el_qwords && (size_t) (i + start_qword) < n_qwords; i++) {
              types[i + start_qword] = get_result_type (subtypes[i], types[i + start_qword]);
              if (span_qwords > n_el_qwords)
                types[i + start_qword + 1]
                  = get_result_type (subtypes[i], types[i + start_qword + 1]);
            }
          }
        }
      break;
    default: assert (FALSE);
    }

    if (n_qwords > 2) return 0; /* as we don't have vector values (see SSEUP_CLASS) */

    for (i = 0; (size_t) i < n_qwords; i++) {
      if (types[i] == MIR_T_UNDEF) return 0; /* pass in memory if a word class is memory.  */
      if ((enum add_arg_class) types[i] == X87UP_CLASS && (i == 0 || types[i - 1] != MIR_T_LD))
        return 0;
    }
    return n_qwords;
#else
    types[0] = MIR_T_I64;
    return 1;
#endif
  }

  assert (scalar_type_p (type));
  switch (mir_type = get_mir_type (c2m_ctx, type)) {
  case MIR_T_F:
  case MIR_T_D: types[0] = MIR_T_D; return 1;
  case MIR_T_LD:
    types[0] = MIR_T_LD;
    types[1] = (MIR_type_t) X87UP_CLASS;
    return 2;
  default: types[0] = MIR_T_I64; return 1;
  }
}